

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClau.c
# Opt level: O0

Vec_Int_t * Fra_ClauSaveInputVars(Aig_Man_t *pMan,Cnf_Dat_t *pCnf,int nStarting)

{
  int iVar1;
  Vec_Int_t *p;
  void *pvVar2;
  int local_34;
  int i;
  Aig_Obj_t *pObj;
  Vec_Int_t *vVars;
  int nStarting_local;
  Cnf_Dat_t *pCnf_local;
  Aig_Man_t *pMan_local;
  
  iVar1 = Aig_ManCiNum(pMan);
  p = Vec_IntAlloc(iVar1 - nStarting);
  for (local_34 = 0; iVar1 = Vec_PtrSize(pMan->vCis), local_34 < iVar1; local_34 = local_34 + 1) {
    pvVar2 = Vec_PtrEntry(pMan->vCis,local_34);
    if (nStarting <= local_34) {
      Vec_IntPush(p,pCnf->pVarNums[*(int *)((long)pvVar2 + 0x24)]);
    }
  }
  return p;
}

Assistant:

Vec_Int_t * Fra_ClauSaveInputVars( Aig_Man_t * pMan, Cnf_Dat_t * pCnf, int nStarting )
{
    Vec_Int_t * vVars;
    Aig_Obj_t * pObj;
    int i;
    vVars = Vec_IntAlloc( Aig_ManCiNum(pMan) - nStarting );
    Aig_ManForEachCi( pMan, pObj, i )
    {
        if ( i < nStarting )
            continue;
        Vec_IntPush( vVars, pCnf->pVarNums[pObj->Id] );
    }
    return vVars;
}